

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O3

void __thiscall
crn::corpus_tester::print_comparative_metric_stats
          (corpus_tester *this,command_line_params *cmd_line_params,
          vector<crnlib::image_utils::error_metrics> *stats1,
          vector<crnlib::image_utils::error_metrics> *stats2,uint num_blocks_x,uint num_blocks_y)

{
  double dVar1;
  double dVar2;
  error_metrics *peVar3;
  error_metrics *peVar4;
  void *p;
  uint uVar5;
  uint *puVar6;
  param_map_const_iterator pVar7;
  uint *puVar8;
  ulong uVar9;
  long lVar10;
  undefined4 uVar11;
  ulong uVar12;
  uint uVar13;
  float fVar14;
  vector<unsigned_int> worse_blocks;
  vector<unsigned_int> indices [2];
  elemental_vector local_a8;
  elemental_vector local_98;
  elemental_vector local_88;
  elemental_vector local_78;
  elemental_vector local_68;
  elemental_vector local_58;
  uint local_44;
  command_line_params *local_40;
  double local_38;
  
  local_88.m_p = (void *)0x0;
  local_88.m_size = 0;
  local_88.m_capacity = 0;
  local_98.m_p = (void *)0x0;
  local_98.m_size = 0;
  local_98.m_capacity = 0;
  local_a8.m_p = (void *)0x0;
  local_a8.m_size = 0;
  local_a8.m_capacity = 0;
  local_78.m_p = (float *)0x0;
  local_78.m_size = 0;
  local_78.m_capacity = 0;
  local_44 = num_blocks_x;
  if (stats1->m_size == 0) {
    fVar14 = 0.0;
    uVar12 = 0;
  }
  else {
    lVar10 = 0x20;
    uVar12 = 0;
    local_40 = cmd_line_params;
    do {
      peVar3 = stats1->m_p;
      peVar4 = stats2->m_p;
      dVar1 = *(double *)((long)&peVar3->mMax + lVar10);
      dVar2 = *(double *)((long)&peVar4->mMax + lVar10);
      uVar11 = (undefined4)uVar12;
      if (dVar2 <= dVar1) {
        if (0.0010000000474974513 <= ABS(dVar1 - dVar2)) {
          if (local_88.m_capacity <= local_88.m_size) {
            crnlib::elemental_vector::increase_capacity
                      (&local_88,local_88.m_size + 1,true,4,(object_mover)0x0,false);
          }
          *(undefined4 *)((long)local_88.m_p + (ulong)local_88.m_size * 4) = uVar11;
          puVar6 = &local_88.m_size;
        }
        else {
          if (local_98.m_capacity <= local_98.m_size) {
            crnlib::elemental_vector::increase_capacity
                      (&local_98,local_98.m_size + 1,true,4,(object_mover)0x0,false);
          }
          *(undefined4 *)((long)local_98.m_p + (ulong)local_98.m_size * 4) = uVar11;
          puVar6 = &local_98.m_size;
        }
      }
      else {
        if (local_a8.m_capacity <= local_a8.m_size) {
          crnlib::elemental_vector::increase_capacity
                    (&local_a8,local_a8.m_size + 1,true,4,(object_mover)0x0,false);
        }
        *(undefined4 *)((long)local_a8.m_p + (ulong)local_a8.m_size * 4) = uVar11;
        local_a8.m_size = local_a8.m_size + 1;
        dVar1 = *(double *)((long)&peVar4->mMax + lVar10) -
                *(double *)((long)&peVar3->mMax + lVar10);
        if (local_78.m_capacity <= local_78.m_size) {
          local_38 = dVar1;
          crnlib::elemental_vector::increase_capacity
                    (&local_78,local_78.m_size + 1,true,4,(object_mover)0x0,false);
          dVar1 = local_38;
        }
        *(float *)((long)local_78.m_p + (ulong)local_78.m_size * 4) = (float)dVar1;
        puVar6 = &local_78.m_size;
      }
      *puVar6 = *puVar6 + 1;
      uVar12 = uVar12 + 1;
      lVar10 = lVar10 + 0x28;
    } while (uVar12 < stats1->m_size);
    uVar12 = local_a8._8_8_ & 0xffffffff;
    fVar14 = (float)stats1->m_size;
    cmd_line_params = local_40;
  }
  crnlib::console::printf
            ("Num worse blocks: %u, %3.3f%%",SUB84((double)(((float)uVar12 * 100.0) / fVar14),0));
  crnlib::console::printf
            ("Num equal blocks: %u, %3.3f%%",
             SUB84((double)(((float)(local_98._8_8_ & 0xffffffff) * 100.0) / (float)stats1->m_size),
                   0));
  crnlib::console::printf
            ("Num better blocks: %u, %3.3f%%",
             SUB84((double)(((float)(local_88._8_8_ & 0xffffffff) * 100.0) / (float)stats1->m_size),
                   0));
  crnlib::console::printf
            ("Num equal+better blocks: %u, %3.3f%%",
             SUB84((double)(((float)(local_88.m_size + local_98.m_size) * 100.0) /
                           (float)stats1->m_size),0));
  pVar7 = crnlib::command_line_params::get_param(cmd_line_params,"nobadblocks",0);
  if ((_Rb_tree_header *)pVar7._M_node ==
      &(cmd_line_params->m_param_map)._M_t._M_impl.super__Rb_tree_header) {
    local_58.m_p = (uint *)0x0;
    local_58.m_size = 0;
    local_58.m_capacity = 0;
    local_68.m_p = (uint *)0x0;
    local_68.m_size = 0;
    local_68.m_capacity = 0;
    uVar13 = local_a8.m_size;
    if (local_a8.m_size != 0) {
      crnlib::elemental_vector::increase_capacity
                (&local_68,local_a8.m_size,local_a8.m_size == 1,4,(object_mover)0x0,false);
      memset((uint *)((long)local_68.m_p + (local_68._8_8_ & 0xffffffff) * 4),0,
             (ulong)(uVar13 - local_68.m_size) << 2);
      uVar5 = local_a8.m_size;
      local_68.m_size = uVar13;
      uVar13 = local_58.m_size;
      if (local_58.m_size != local_a8.m_size) {
        uVar13 = local_a8.m_size;
        if (local_58.m_size < local_a8.m_size || local_58.m_size == local_a8.m_size) {
          if (local_58.m_capacity < local_a8.m_size) {
            crnlib::elemental_vector::increase_capacity
                      (&local_58,local_a8.m_size,local_58.m_size + 1 == local_a8.m_size,4,
                       (object_mover)0x0,false);
          }
          memset((uint *)((long)local_58.m_p + (ulong)local_58.m_size * 4),0,
                 (ulong)(uVar5 - local_58.m_size) << 2);
          uVar13 = local_a8.m_size;
        }
        local_58.m_size = uVar5;
      }
      if (uVar13 != 0) {
        puVar8 = crnlib::indirect_radix_sort<unsigned_int,float>
                           (uVar13,(uint *)local_68.m_p,(uint *)local_58.m_p,(float *)local_78.m_p,0
                            ,4,true);
        crnlib::console::printf("List of worse blocks sorted by delta PSNR:");
        if (local_a8.m_size != 0) {
          uVar12 = 0;
          do {
            uVar9 = (ulong)*(uint *)((long)local_a8.m_p + (ulong)puVar8[uVar12] * 4);
            dVar1 = stats1->m_p[uVar9].mPeakSNR;
            dVar2 = stats2->m_p[uVar9].mPeakSNR;
            crnlib::console::printf
                      ("%u. [%u,%u] %3.3f %3.3f %3.3f",SUB84(dVar1,0),dVar2,dVar2 - dVar1,
                       uVar12 & 0xffffffff,uVar9 % (ulong)local_44,uVar9 / local_44);
            uVar12 = uVar12 + 1;
          } while (uVar12 < (local_a8._8_8_ & 0xffffffff));
        }
      }
    }
    lVar10 = 0x20;
    do {
      p = *(void **)((long)&local_78.m_p + lVar10);
      if (p != (void *)0x0) {
        crnlib::crnlib_free(p);
      }
      lVar10 = lVar10 + -0x10;
    } while (lVar10 != 0);
  }
  if ((float *)local_78.m_p != (float *)0x0) {
    crnlib::crnlib_free(local_78.m_p);
  }
  if (local_a8.m_p != (void *)0x0) {
    crnlib::crnlib_free(local_a8.m_p);
  }
  if (local_98.m_p != (void *)0x0) {
    crnlib::crnlib_free(local_98.m_p);
  }
  if (local_88.m_p != (void *)0x0) {
    crnlib::crnlib_free(local_88.m_p);
  }
  return;
}

Assistant:

void corpus_tester::print_comparative_metric_stats(const command_line_params& cmd_line_params, const crnlib::vector<image_utils::error_metrics>& stats1, const crnlib::vector<image_utils::error_metrics>& stats2, uint num_blocks_x, uint num_blocks_y)
    {
        num_blocks_y;

        crnlib::vector<uint> better_blocks;
        crnlib::vector<uint> equal_blocks;
        crnlib::vector<uint> worse_blocks;
        crnlib::vector<float> delta_psnr;

        for (uint i = 0; i < stats1.size(); i++)
        {
            //uint bx = i % num_blocks_x;
            //uint by = i / num_blocks_x;

            const image_utils::error_metrics& em1 = stats1[i];
            const image_utils::error_metrics& em2 = stats2[i];

            if (em1.mPeakSNR < em2.mPeakSNR)
            {
                worse_blocks.push_back(i);
                delta_psnr.push_back((float)(em2.mPeakSNR - em1.mPeakSNR));
            }
            else if (fabs(em1.mPeakSNR - em2.mPeakSNR) < .001f)
            {
                equal_blocks.push_back(i);
            }
            else
            {
                better_blocks.push_back(i);
            }
        }

        console::printf("Num worse blocks: %u, %3.3f%%", worse_blocks.size(), worse_blocks.size() * 100.0f / stats1.size());
        console::printf("Num equal blocks: %u, %3.3f%%", equal_blocks.size(), equal_blocks.size() * 100.0f / stats1.size());
        console::printf("Num better blocks: %u, %3.3f%%", better_blocks.size(), better_blocks.size() * 100.0f / stats1.size());
        console::printf("Num equal+better blocks: %u, %3.3f%%", equal_blocks.size() + better_blocks.size(), (equal_blocks.size() + better_blocks.size()) * 100.0f / stats1.size());

        if (!cmd_line_params.has_key("nobadblocks"))
        {
            crnlib::vector<uint> indices[2];
            indices[0].resize(worse_blocks.size());
            indices[1].resize(worse_blocks.size());

            uint* pSorted_indices = nullptr;
            if (worse_blocks.size())
            {
                pSorted_indices = indirect_radix_sort(worse_blocks.size(), &indices[0][0], &indices[1][0], &delta_psnr[0], 0, sizeof(float), true);

                console::printf("List of worse blocks sorted by delta PSNR:");
                for (uint i = 0; i < worse_blocks.size(); i++)
                {
                    uint block_index = worse_blocks[pSorted_indices[i]];
                    uint bx = block_index % num_blocks_x;
                    uint by = block_index / num_blocks_x;

                    console::printf("%u. [%u,%u] %3.3f %3.3f %3.3f",
                        i,
                        bx, by,
                        stats1[block_index].mPeakSNR,
                        stats2[block_index].mPeakSNR,
                        stats2[block_index].mPeakSNR - stats1[block_index].mPeakSNR);
                }
            }
        }
    }